

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PMap::PMap(PMap *this,PType *keytype,PType *valtype)

{
  char *pcVar1;
  char *pcVar2;
  PType *valtype_local;
  PType *keytype_local;
  PMap *this_local;
  
  PCompoundType::PCompoundType(&this->super_PCompoundType);
  (this->super_PCompoundType).super_PType.super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f3a20;
  this->KeyType = keytype;
  this->ValueType = valtype;
  pcVar1 = PType::DescriptiveName(keytype);
  pcVar2 = PType::DescriptiveName(valtype);
  FString::Format(&(this->super_PCompoundType).super_PType.mDescriptiveName,"Map<%s, %s>",pcVar1,
                  pcVar2);
  *(undefined4 *)&(this->super_PCompoundType).super_PType.super_PTypeBase.super_DObject.field_0x24 =
       0x18;
  (this->super_PCompoundType).super_PType.Align = 8;
  return;
}

Assistant:

PMap::PMap(PType *keytype, PType *valtype)
: KeyType(keytype), ValueType(valtype)
{
	mDescriptiveName.Format("Map<%s, %s>", keytype->DescriptiveName(), valtype->DescriptiveName());
	Size = sizeof(FMap);
	Align = alignof(FMap);
}